

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void ThrowUnlessContains<unsigned_char>
               (uchar x,vector<unsigned_char,_std::allocator<unsigned_char>_> *v,char *msg)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var1;
  runtime_error *this;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                    ((v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current !=
      (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,msg);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ThrowUnlessContains(T x, const std::vector<T>& v, const char* msg) {
  if (std::find(v.begin(), v.end(), x) == v.end()) {
    throw Error(msg);
  }
}